

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O1

int Gia_ManFindXor(word **pSets,Vec_Ptr_t *vDivs,int nWords,Vec_Int_t *vBinateVars,
                  Vec_Int_t **vUnatePairs,int fVerbose)

{
  Vec_Int_t *vUnatePairs_00;
  int iVar1;
  int extraout_EDX;
  int extraout_EDX_00;
  Vec_Ptr_t *pOn;
  ulong uVar2;
  
  pOn = vDivs;
  if (fVerbose != 0) {
    printf("  ");
  }
  uVar2 = 0;
  do {
    vUnatePairs_00 = vUnatePairs[uVar2];
    vUnatePairs_00->nSize = 0;
    Gia_ManFindXorInt(pSets[uVar2],(word *)pOn,vBinateVars,vDivs,nWords,vUnatePairs_00);
    iVar1 = extraout_EDX;
    if (fVerbose != 0) {
      pOn = (Vec_Ptr_t *)(uVar2 & 0xffffffff);
      printf("UX%d =%5d ",pOn,(ulong)(uint)vUnatePairs[uVar2]->nSize);
      iVar1 = extraout_EDX_00;
    }
    uVar2 = uVar2 + 1;
  } while (uVar2 == 1);
  iVar1 = Gia_ManFindFirstCommonLit(*vUnatePairs,vUnatePairs[1],iVar1);
  return iVar1;
}

Assistant:

int Gia_ManFindXor( word * pSets[2], Vec_Ptr_t * vDivs, int nWords, Vec_Int_t * vBinateVars, Vec_Int_t * vUnatePairs[2], int fVerbose )
{
    int n;
    if ( fVerbose ) printf( "  " );
    for ( n = 0; n < 2; n++ )
    {
        Vec_IntClear( vUnatePairs[n] );
        Gia_ManFindXorInt( pSets[n], pSets[!n], vBinateVars, vDivs, nWords, vUnatePairs[n] );
        if ( fVerbose ) printf( "UX%d =%5d ", n, Vec_IntSize(vUnatePairs[n]) );
    }
    return Gia_ManFindFirstCommonLit( vUnatePairs[0], vUnatePairs[1], fVerbose );
}